

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rapass.cpp
# Opt level: O1

void asmjit::RAPass_reset(BaseRAPass *self,FuncDetail *funcDetail)

{
  uint32_t group;
  long lVar1;
  
  (self->_workRegs).super_ZoneVectorBase._data = (void *)0x0;
  (self->_workRegs).super_ZoneVectorBase._size = 0;
  (self->_workRegs).super_ZoneVectorBase._capacity = 0;
  (self->_blocks).super_ZoneVectorBase._data = (void *)0x0;
  (self->_blocks).super_ZoneVectorBase._size = 0;
  (self->_blocks).super_ZoneVectorBase._capacity = 0;
  (self->_exits).super_ZoneVectorBase._data = (void *)0x0;
  (self->_exits).super_ZoneVectorBase._size = 0;
  (self->_exits).super_ZoneVectorBase._capacity = 0;
  (self->_pov).super_ZoneVectorBase._data = (void *)0x0;
  (self->_pov).super_ZoneVectorBase._size = 0;
  (self->_pov).super_ZoneVectorBase._capacity = 0;
  self->_instructionCount = 0;
  self->_createdBlockCount = 0;
  (self->_sharedAssignments).super_ZoneVectorBase._data = (void *)0x0;
  (self->_sharedAssignments).super_ZoneVectorBase._size = 0;
  (self->_sharedAssignments).super_ZoneVectorBase._capacity = 0;
  self->_lastTimestamp = 0;
  self->_archTraits = (ArchTraits *)0x0;
  self->_physRegIndex = (RARegCount)0x0;
  self->_physRegCount = (anon_union_4_2_ebeb14a8_for_RARegCount_0)0x0;
  lVar1 = 0;
  self->_physRegTotal = 0;
  self->_scratchRegIndexes[0] = 0xff;
  self->_scratchRegIndexes[1] = 0xff;
  (self->_availableRegs)._masks[0] = 0;
  (self->_availableRegs)._masks[1] = 0;
  (self->_availableRegs)._masks[2] = 0;
  (self->_availableRegs)._masks[3] = 0;
  self->_availableRegCount = (anon_union_4_2_ebeb14a8_for_RARegCount_0)0x0;
  (self->_clobberedRegs)._masks[0] = 0;
  (self->_clobberedRegs)._masks[1] = 0;
  (self->_clobberedRegs)._masks[2] = 0;
  (self->_clobberedRegs)._masks[3] = 0;
  self->_workRegsOfGroup[0].super_ZoneVectorBase._data = (void *)0x0;
  self->_workRegsOfGroup[0].super_ZoneVectorBase._size = 0;
  self->_workRegsOfGroup[0].super_ZoneVectorBase._capacity = 0;
  self->_workRegsOfGroup[1].super_ZoneVectorBase._data = (void *)0x0;
  self->_workRegsOfGroup[1].super_ZoneVectorBase._size = 0;
  self->_workRegsOfGroup[1].super_ZoneVectorBase._capacity = 0;
  self->_workRegsOfGroup[2].super_ZoneVectorBase._data = (void *)0x0;
  self->_workRegsOfGroup[2].super_ZoneVectorBase._size = 0;
  self->_workRegsOfGroup[2].super_ZoneVectorBase._capacity = 0;
  self->_workRegsOfGroup[3].super_ZoneVectorBase._data = (void *)0x0;
  self->_workRegsOfGroup[3].super_ZoneVectorBase._size = 0;
  self->_workRegsOfGroup[3].super_ZoneVectorBase._capacity = 0;
  do {
    self->_strategy[lVar1]._type = '\0';
    self->_globalLiveSpans[lVar1] = (LiveRegSpans *)0x0;
    lVar1 = lVar1 + 1;
  } while (lVar1 != 4);
  (self->_globalMaxLiveCount).n[0] = 0;
  (self->_globalMaxLiveCount).n[1] = 0;
  (self->_globalMaxLiveCount).n[2] = 0;
  (self->_globalMaxLiveCount).n[3] = 0;
  (self->_temporaryMem).super_Operand_._signature = 0;
  (self->_temporaryMem).super_Operand_._baseId = 0;
  (self->_temporaryMem).super_Operand_._data[0] = 0;
  (self->_temporaryMem).super_Operand_._data[1] = 0;
  (self->_stackAllocator)._allocator = &self->_allocator;
  (self->_stackAllocator)._bytesUsed = 0;
  (self->_stackAllocator)._stackSize = 0;
  (self->_stackAllocator)._alignment = 1;
  (self->_stackAllocator)._slots.super_ZoneVectorBase._data = (void *)0x0;
  (self->_stackAllocator)._slots.super_ZoneVectorBase._size = 0;
  (self->_stackAllocator)._slots.super_ZoneVectorBase._capacity = 0;
  (self->_argsAssignment)._funcDetail = funcDetail;
  (self->_argsAssignment)._saRegId = 0xff;
  memset((self->_argsAssignment)._reserved,0,0x103);
  self->_numStackArgsToStackSlots = 0;
  self->_maxWorkRegNameSize = 0;
  return;
}

Assistant:

static void RAPass_reset(BaseRAPass* self, FuncDetail* funcDetail) noexcept {
  ZoneAllocator* allocator = self->allocator();

  self->_blocks.reset();
  self->_exits.reset();
  self->_pov.reset();
  self->_workRegs.reset();
  self->_instructionCount = 0;
  self->_createdBlockCount = 0;

  self->_sharedAssignments.reset();
  self->_lastTimestamp = 0;

  self->_archTraits = nullptr;
  self->_physRegIndex.reset();
  self->_physRegCount.reset();
  self->_physRegTotal = 0;

  for (size_t i = 0; i < ASMJIT_ARRAY_SIZE(self->_scratchRegIndexes); i++)
    self->_scratchRegIndexes[i] = BaseReg::kIdBad;

  self->_availableRegs.reset();
  self->_availableRegCount.reset();
  self->_clobberedRegs.reset();

  self->_workRegs.reset();
  for (uint32_t group = 0; group < BaseReg::kGroupVirt; group++) {
    self->_workRegsOfGroup[group].reset();
    self->_strategy[group].reset();
    self->_globalLiveSpans[group] = nullptr;
  }
  self->_globalMaxLiveCount.reset();
  self->_temporaryMem.reset();

  self->_stackAllocator.reset(allocator);
  self->_argsAssignment.reset(funcDetail);
  self->_numStackArgsToStackSlots = 0;
  self->_maxWorkRegNameSize = 0;
}